

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O1

FT_Error cff_charset_compute_cids(CFF_Charset charset,FT_UInt num_glyphs,FT_Memory memory)

{
  FT_UShort *pFVar1;
  FT_UShort *pFVar2;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  ushort uVar6;
  FT_Error local_2c [2];
  FT_Error error;
  
  local_2c[0] = 0;
  if (charset->max_cid == 0) {
    if (num_glyphs == 0) {
      uVar5 = 0;
    }
    else {
      uVar4 = 0;
      uVar6 = 0;
      do {
        uVar5 = charset->sids[uVar4];
        if (charset->sids[uVar4] <= uVar6) {
          uVar5 = uVar6;
        }
        uVar4 = uVar4 + 1;
        uVar6 = uVar5;
      } while (num_glyphs != uVar4);
    }
    pFVar2 = (FT_UShort *)ft_mem_realloc(memory,2,0,(ulong)(uint)uVar5 + 1,(void *)0x0,local_2c);
    charset->cids = pFVar2;
    if (local_2c[0] == 0) {
      if (num_glyphs != 0) {
        pFVar1 = charset->sids;
        lVar3 = (ulong)num_glyphs + 1;
        do {
          pFVar2[pFVar1[lVar3 + -2]] = (short)lVar3 - 2;
          lVar3 = lVar3 + -1;
        } while (1 < lVar3);
      }
      charset->max_cid = (uint)uVar5;
      charset->num_glyphs = num_glyphs;
    }
  }
  return local_2c[0];
}

Assistant:

static FT_Error
  cff_charset_compute_cids( CFF_Charset  charset,
                            FT_UInt      num_glyphs,
                            FT_Memory    memory )
  {
    FT_Error   error   = FT_Err_Ok;
    FT_UInt    i;
    FT_Long    j;
    FT_UShort  max_cid = 0;


    if ( charset->max_cid > 0 )
      goto Exit;

    for ( i = 0; i < num_glyphs; i++ )
    {
      if ( charset->sids[i] > max_cid )
        max_cid = charset->sids[i];
    }

    if ( FT_NEW_ARRAY( charset->cids, (FT_ULong)max_cid + 1 ) )
      goto Exit;

    /* When multiple GIDs map to the same CID, we choose the lowest */
    /* GID.  This is not described in any spec, but it matches the  */
    /* behaviour of recent Acroread versions.                       */
    for ( j = (FT_Long)num_glyphs - 1; j >= 0; j-- )
      charset->cids[charset->sids[j]] = (FT_UShort)j;

    charset->max_cid    = max_cid;
    charset->num_glyphs = num_glyphs;

  Exit:
    return error;
  }